

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_round_to_int_riscv64(float128 a,float_status *status)

{
  float128 fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  float128 fVar12;
  
  uVar8 = a.high;
  uVar9 = a.low;
  uVar10 = a.high._6_2_ & 0x7fff;
  if (0x402e < uVar10) {
    if (0x406e < uVar10) {
      if (uVar10 != 0x7fff) {
        return a;
      }
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
          uVar9 != 0) {
        fVar12 = propagateFloat128NaN(a,a,status);
        return fVar12;
      }
      return a;
    }
    uVar4 = 2L << (0x6eU - (char)uVar10 & 0x3f);
    if (5 < (byte)status->float_rounding_mode) {
LAB_00c53978:
      abort();
    }
    uVar6 = uVar4 - 1;
    uVar7 = uVar8;
    uVar5 = uVar9;
    switch(status->float_rounding_mode) {
    case '\0':
      if (uVar10 == 0x402f) {
        if ((long)uVar9 < 0) {
          uVar7 = uVar8 + 1 & 0xfffffffffffffffe;
          if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
          {
            uVar7 = uVar8 + 1;
          }
        }
      }
      else {
        uVar5 = (uVar4 >> 1) + uVar9;
        uVar7 = uVar8 + CARRY8(uVar4 >> 1,uVar9);
        if ((uVar5 & uVar6) == 0) {
          uVar5 = uVar5 & ~uVar4;
        }
      }
      break;
    case '\x01':
      if ((long)uVar8 < 0) {
LAB_00c538cd:
        uVar7 = uVar8 + CARRY8(uVar6,uVar9);
        uVar5 = uVar6 + uVar9;
      }
      break;
    case '\x02':
      if (-1 < (long)uVar8) goto LAB_00c538cd;
      break;
    case '\x04':
      if (uVar10 == 0x402f) {
        uVar7 = uVar8 - ((long)uVar9 >> 0x3f);
      }
      else {
        uVar7 = uVar8 + CARRY8(uVar4 >> 1,uVar9);
        uVar5 = (uVar4 >> 1) + uVar9;
      }
      break;
    case '\x05':
      uVar11 = (ulong)((uint)a.high & 1);
      if (uVar10 != 0x402f) {
        uVar11 = uVar4 & uVar9;
      }
      if (uVar11 == 0) goto LAB_00c538cd;
    }
    uVar5 = -uVar4 & uVar5;
LAB_00c53967:
    fVar1.high = uVar7;
    fVar1.low = uVar5;
    fVar12.high = uVar7;
    fVar12.low = uVar5;
    if ((uVar5 == uVar9) && (uVar7 == uVar8)) {
      return fVar12;
    }
    status->float_exception_flags = status->float_exception_flags | 0x20;
    return fVar1;
  }
  if (0x3ffe < uVar10) {
    uVar4 = 1L << (0x2fU - (char)uVar10 & 0x3f);
    if (5 < (byte)status->float_rounding_mode) goto LAB_00c53978;
    uVar7 = uVar8;
    switch(status->float_rounding_mode) {
    case '\0':
      uVar7 = (uVar4 >> 1) + uVar8;
      if ((uVar4 - 1 & uVar7) == 0 && uVar9 == 0) {
        uVar7 = uVar7 & ~uVar4;
      }
      break;
    case '\x01':
      if ((long)uVar8 < 0) {
LAB_00c53888:
        uVar7 = (uVar4 - 1) + (uVar9 != 0 | uVar8);
      }
      break;
    case '\x02':
      if (-1 < (long)uVar8) goto LAB_00c53888;
      break;
    case '\x04':
      uVar7 = (uVar4 >> 1) + uVar8;
      break;
    case '\x05':
      if ((uVar4 & uVar8) == 0) goto LAB_00c53888;
    }
    uVar7 = -uVar4 & uVar7;
    uVar5 = 0;
    goto LAB_00c53967;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 &&
      uVar9 == 0) {
    return a;
  }
  uVar4 = 0x8000000000000000;
  status->float_exception_flags = status->float_exception_flags | 0x20;
  uVar6 = uVar8 & 0x8000000000000000;
  switch(status->float_rounding_mode) {
  case '\0':
    if ((uVar10 != 0x3ffe) ||
       (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        uVar9 == 0)) goto switchD_00c53731_caseD_3;
    break;
  case '\x01':
    uVar6 = (long)uVar8 >> 0x3f & 0xbfff000000000000;
    goto switchD_00c53731_caseD_3;
  case '\x02':
    if (-1 < (long)uVar8) {
      uVar4 = 0x3fff000000000000;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    return (float128)(auVar2 << 0x40);
  default:
    goto switchD_00c53731_caseD_3;
  case '\x04':
    if (uVar10 != 0x3ffe) goto switchD_00c53731_caseD_3;
    break;
  case '\x05':
    break;
  }
  uVar6 = uVar8 & 0x8000000000000000 | 0x3fff000000000000;
switchD_00c53731_caseD_3:
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  return (float128)(auVar3 << 0x40);
}

Assistant:

float128 float128_round_to_int(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t lastBitMask, roundBitsMask;
    float128 z;

    aExp = extractFloat128Exp( a );
    if ( 0x402F <= aExp ) {
        if ( 0x406F <= aExp ) {
            if (    ( aExp == 0x7FFF )
                 && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) )
               ) {
                return propagateFloat128NaN(a, a, status);
            }
            return a;
        }
        lastBitMask = 1;
        lastBitMask = ( lastBitMask<<( 0x406E - aExp ) )<<1;
        roundBitsMask = lastBitMask - 1;
        z = a;
        switch (status->float_rounding_mode) {
        case float_round_nearest_even:
            if ( lastBitMask ) {
                add128( z.high, z.low, 0, lastBitMask>>1, &z.high, &z.low );
                if ( ( z.low & roundBitsMask ) == 0 ) z.low &= ~ lastBitMask;
            }
            else {
                if ( (int64_t) z.low < 0 ) {
                    ++z.high;
                    if ( (uint64_t) ( z.low<<1 ) == 0 ) z.high &= ~1;
                }
            }
            break;
        case float_round_ties_away:
            if (lastBitMask) {
                add128(z.high, z.low, 0, lastBitMask >> 1, &z.high, &z.low);
            } else {
                if ((int64_t) z.low < 0) {
                    ++z.high;
                }
            }
            break;
        case float_round_to_zero:
            break;
        case float_round_up:
            if (!extractFloat128Sign(z)) {
                add128(z.high, z.low, 0, roundBitsMask, &z.high, &z.low);
            }
            break;
        case float_round_down:
            if (extractFloat128Sign(z)) {
                add128(z.high, z.low, 0, roundBitsMask, &z.high, &z.low);
            }
            break;
        case float_round_to_odd:
            /*
             * Note that if lastBitMask == 0, the last bit is the lsb
             * of high, and roundBitsMask == -1.
             */
            if ((lastBitMask ? z.low & lastBitMask : z.high & 1) == 0) {
                add128(z.high, z.low, 0, roundBitsMask, &z.high, &z.low);
            }
            break;
        default:
            abort();
        }
        z.low &= ~ roundBitsMask;
    }
    else {
        if ( aExp < 0x3FFF ) {
            if ( ( ( (uint64_t) ( a.high<<1 ) ) | a.low ) == 0 ) return a;
            status->float_exception_flags |= float_flag_inexact;
            aSign = extractFloat128Sign( a );
            switch (status->float_rounding_mode) {
            case float_round_nearest_even:
                if (    ( aExp == 0x3FFE )
                     && (   extractFloat128Frac0( a )
                          | extractFloat128Frac1( a ) )
                   ) {
                    return packFloat128( aSign, 0x3FFF, 0, 0 );
                }
                break;
            case float_round_ties_away:
                if (aExp == 0x3FFE) {
                    return packFloat128(aSign, 0x3FFF, 0, 0);
                }
                break;
            case float_round_down:
                return
                      aSign ? packFloat128( 1, 0x3FFF, 0, 0 )
                    : packFloat128( 0, 0, 0, 0 );
            case float_round_up:
                return
                      aSign ? packFloat128( 1, 0, 0, 0 )
                    : packFloat128( 0, 0x3FFF, 0, 0 );

            case float_round_to_odd:
                return packFloat128(aSign, 0x3FFF, 0, 0);
            }
            return packFloat128( aSign, 0, 0, 0 );
        }
        lastBitMask = 1;
        lastBitMask <<= 0x402F - aExp;
        roundBitsMask = lastBitMask - 1;
        z.low = 0;
        z.high = a.high;
        switch (status->float_rounding_mode) {
        case float_round_nearest_even:
            z.high += lastBitMask>>1;
            if ( ( ( z.high & roundBitsMask ) | a.low ) == 0 ) {
                z.high &= ~ lastBitMask;
            }
            break;
        case float_round_ties_away:
            z.high += lastBitMask>>1;
            break;
        case float_round_to_zero:
            break;
        case float_round_up:
            if (!extractFloat128Sign(z)) {
                z.high |= ( a.low != 0 );
                z.high += roundBitsMask;
            }
            break;
        case float_round_down:
            if (extractFloat128Sign(z)) {
                z.high |= (a.low != 0);
                z.high += roundBitsMask;
            }
            break;
        case float_round_to_odd:
            if ((z.high & lastBitMask) == 0) {
                z.high |= (a.low != 0);
                z.high += roundBitsMask;
            }
            break;
        default:
            abort();
        }
        z.high &= ~ roundBitsMask;
    }
    if ( ( z.low != a.low ) || ( z.high != a.high ) ) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}